

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O1

void __thiscall NameServer::loadMeta(NameServer *this)

{
  int iVar1;
  char *__nptr;
  char cVar2;
  basic_iserializer *pbVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  string currenetId;
  text_iarchive block_server_ov;
  text_iarchive file_len_ov;
  text_iarchive file_block_ov;
  text_iarchive id_file_ov;
  ifstream currentId_meta;
  ifstream id_file_meta;
  ifstream block_server_meta;
  ifstream file_len_meta;
  ifstream file_block_meta;
  char *local_c78;
  undefined8 local_c70;
  char local_c68 [16];
  char *local_c58;
  undefined1 local_c50 [128];
  undefined1 local_bd0 [128];
  undefined1 local_b50 [128];
  undefined1 local_ad0 [128];
  long local_a50 [65];
  long local_848 [4];
  byte abStack_828 [488];
  istream local_640 [520];
  istream local_438 [520];
  istream local_230 [520];
  
  std::ifstream::ifstream(local_848,"dfsfiles/namenode/id-logicpath-meta",_S_in);
  if ((abStack_828[*(long *)(local_848[0] + -0x18)] & 5) != 0) {
LAB_00116ee5:
    std::ifstream::~ifstream(local_848);
    return;
  }
  boost::archive::text_iarchive::text_iarchive((text_iarchive *)local_ad0,(istream *)local_848,0);
  pbVar3 = &boost::serialization::
            singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_std::map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>_>_>_>
            ::get_instance()->super_basic_iserializer;
  boost::archive::detail::basic_iarchive::load_object
            ((basic_iarchive *)local_ad0,&fileid_path_lenMap_abi_cxx11_,pbVar3);
  std::ifstream::close();
  std::ifstream::ifstream(local_230,"dfsfiles/namenode/logicpath-blocks-meta",_S_in);
  boost::archive::text_iarchive::text_iarchive((text_iarchive *)local_b50,local_230,0);
  pbVar3 = &boost::serialization::
            singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
            ::get_instance()->super_basic_iserializer;
  boost::archive::detail::basic_iarchive::load_object
            ((basic_iarchive *)local_b50,&logicFile_BlockFileMap_abi_cxx11_,pbVar3);
  std::ifstream::close();
  std::ifstream::ifstream(local_438,"dfsfiles/namenode/logicpath-len-meta",_S_in);
  boost::archive::text_iarchive::text_iarchive((text_iarchive *)local_bd0,local_438,0);
  pbVar3 = &boost::serialization::
            singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>_>_>
            ::get_instance()->super_basic_iserializer;
  boost::archive::detail::basic_iarchive::load_object
            ((basic_iarchive *)local_bd0,&path_lenMap_abi_cxx11_,pbVar3);
  std::ifstream::close();
  std::ifstream::ifstream(local_640,"dfsfiles/namenode/block-servers-meta",_S_in);
  boost::archive::text_iarchive::text_iarchive((text_iarchive *)local_c50,local_640,0);
  pbVar3 = &boost::serialization::
            singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            ::get_instance()->super_basic_iserializer;
  boost::archive::detail::basic_iarchive::load_object
            ((basic_iarchive *)local_c50,&block_serversMap_abi_cxx11_,pbVar3);
  std::ifstream::close();
  std::ifstream::ifstream(local_a50,"dfsfiles/namenode/current-id-meta",_S_in);
  local_c70 = 0;
  local_c68[0] = '\0';
  local_c78 = local_c68;
  cVar2 = std::ios::widen((char)local_a50 + (char)*(undefined8 *)(local_a50[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_a50,(string *)&local_c78,cVar2);
  __nptr = local_c78;
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol(__nptr,&local_c58,10);
  if (local_c58 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar5 == lVar5) && (*piVar4 != 0x22)) {
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    fileID = (int)lVar5;
    std::ifstream::close();
    if (local_c78 != local_c68) {
      operator_delete(local_c78);
    }
    std::ifstream::~ifstream(local_a50);
    boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_c50);
    boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
              ((basic_text_iprimitive<std::istream> *)(local_c50 + 0x28));
    std::ifstream::~ifstream(local_640);
    boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_bd0);
    boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
              ((basic_text_iprimitive<std::istream> *)(local_bd0 + 0x28));
    std::ifstream::~ifstream(local_438);
    boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_b50);
    boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
              ((basic_text_iprimitive<std::istream> *)(local_b50 + 0x28));
    std::ifstream::~ifstream(local_230);
    boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_ad0);
    boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
              ((basic_text_iprimitive<std::istream> *)(local_ad0 + 0x28));
    goto LAB_00116ee5;
  }
  uVar6 = std::__throw_out_of_range("stoi");
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_c50);
  boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
            ((basic_text_iprimitive<std::istream> *)(local_c50 + 0x28));
  std::ifstream::~ifstream(local_640);
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_bd0);
  boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
            ((basic_text_iprimitive<std::istream> *)(local_bd0 + 0x28));
  std::ifstream::~ifstream(local_438);
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_b50);
  boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
            ((basic_text_iprimitive<std::istream> *)(local_b50 + 0x28));
  std::ifstream::~ifstream(local_230);
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_ad0);
  boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
            ((basic_text_iprimitive<std::istream> *)(local_ad0 + 0x28));
  std::ifstream::~ifstream(local_848);
  _Unwind_Resume(uVar6);
}

Assistant:

void loadMeta() const
    {
        ifstream id_file_meta("dfsfiles/namenode/id-logicpath-meta");
        if(!id_file_meta)
        {
            return;
        }
        boost::archive::text_iarchive id_file_ov(id_file_meta);
        id_file_ov >> fileid_path_lenMap;
        id_file_meta.close();

        ifstream file_block_meta("dfsfiles/namenode/logicpath-blocks-meta");
        boost::archive::text_iarchive file_block_ov(file_block_meta);
        file_block_ov >> logicFile_BlockFileMap;
        file_block_meta.close();

        ifstream file_len_meta("dfsfiles/namenode/logicpath-len-meta");
        boost::archive::text_iarchive file_len_ov(file_len_meta);
        file_len_ov >> path_lenMap;
        file_len_meta.close();

        ifstream block_server_meta("dfsfiles/namenode/block-servers-meta");
        boost::archive::text_iarchive block_server_ov(block_server_meta);
        block_server_ov >> block_serversMap;
        block_server_meta.close();

        ifstream currentId_meta("dfsfiles/namenode/current-id-meta");
        string currenetId;
        getline(currentId_meta, currenetId);
        fileID = stoi(currenetId);
        currentId_meta.close();

    }